

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

t_operand __thiscall
xemmai::ast::t_while::f_emit(t_while *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_targets *ptVar1;
  t_label *a_label;
  pointer ptVar2;
  t_label *a_label_00;
  t_emit *ptVar3;
  t_operand tVar4;
  undefined1 local_b0 [8];
  t_targets targets1;
  t_label *break0;
  t_targets *targets0;
  t_label *label0;
  t_label *loop;
  bool a_clear_local;
  bool a_operand_local;
  bool a_tail_local;
  t_emit *a_emit_local;
  t_while *this_local;
  anon_union_8_4_0f1077ea_for_t_operand_2 local_10;
  
  t_emit::f_join(a_emit,&this->v_junction_condition);
  a_label = t_emit::f_label(a_emit);
  t_emit::f_target(a_emit,a_label);
  t_emit::f_merge(a_emit,&this->v_junction_condition);
  ptVar2 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
           operator->(&this->v_condition);
  (*ptVar2->_vptr_t_node[3])(ptVar2,a_emit,0,0);
  a_label_00 = t_emit::f_label(a_emit);
  t_emit::f_pop(a_emit);
  ptVar3 = t_emit::operator<<(a_emit,c_instruction__BRANCH);
  ptVar3 = t_emit::operator<<(ptVar3,a_emit->v_stack);
  t_emit::operator<<(ptVar3,a_label_00);
  ptVar1 = a_emit->v_targets;
  local_b0 = (undefined1  [8])t_emit::f_label(a_emit);
  targets1.v_break = (t_label *)&this->v_junction_exit;
  targets1.v_break_junction = (t_block *)a_emit->v_stack;
  targets1.v_continue = (t_label *)&this->v_junction_condition;
  targets1.v_continue_junction = (t_block *)ptVar1->v_return;
  targets1.v_return = (t_label *)ptVar1->v_return_junction;
  targets1.v_return_junction = (t_block *)ptVar1->v_return_stack;
  targets1.v_return_stack._0_1_ = ptVar1->v_return_is_tail & 1;
  a_emit->v_targets = (t_targets *)local_b0;
  targets1.v_break_stack._0_1_ = a_tail;
  targets1.v_break_stack._1_1_ = a_clear;
  targets1._24_8_ = a_label;
  targets1._72_8_ = local_b0;
  anon_unknown_11::f_emit_block_without_value(a_emit,&this->v_block);
  a_emit->v_targets = ptVar1;
  ptVar3 = t_emit::operator<<(a_emit,c_instruction__JUMP);
  t_emit::operator<<(ptVar3,a_label);
  t_emit::f_target(a_emit,a_label_00);
  t_emit::f_join(a_emit,&this->v_junction_exit);
  if (!a_clear) {
    t_emit::f_emit_null(a_emit);
  }
  t_emit::f_target(a_emit,(t_label *)targets1._72_8_);
  t_emit::f_merge(a_emit,&this->v_junction_exit);
  t_operand::t_operand((t_operand *)&this_local);
  tVar4._4_4_ = 0;
  tVar4.v_tag = (uint)this_local;
  tVar4.field_1.v_integer = local_10.v_integer;
  return tVar4;
}

Assistant:

t_operand t_while::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	a_emit.f_join(v_junction_condition);
	auto& loop = a_emit.f_label();
	a_emit.f_target(loop);
	a_emit.f_merge(v_junction_condition);
	v_condition->f_emit(a_emit, false, false);
	auto& label0 = a_emit.f_label();
	a_emit.f_pop();
	a_emit << c_instruction__BRANCH << a_emit.v_stack << label0;
	auto targets0 = a_emit.v_targets;
	auto& break0 = a_emit.f_label();
	t_emit::t_targets targets1{&break0, &v_junction_exit, a_emit.v_stack, a_tail, a_clear, &loop, &v_junction_condition, targets0->v_return, targets0->v_return_junction, targets0->v_return_stack, targets0->v_return_is_tail};
	a_emit.v_targets = &targets1;
	f_emit_block_without_value(a_emit, v_block);
	a_emit.v_targets = targets0;
	a_emit << c_instruction__JUMP << loop;
	a_emit.f_target(label0);
	a_emit.f_join(v_junction_exit);
	if (!a_clear) a_emit.f_emit_null();
	a_emit.f_target(break0);
	a_emit.f_merge(v_junction_exit);
	return {};
}